

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-rb.c
# Opt level: O0

void pp_tree_rb_rotate_left(PTreeRBNode *node,PTreeBaseNode **root)

{
  PTreeRBNode_ *pPVar1;
  PTreeBaseNode *tmp_node;
  PTreeBaseNode **root_local;
  PTreeRBNode *node_local;
  
  pPVar1 = (PTreeRBNode_ *)(node->base).right;
  if (node->parent != (PTreeRBNode_ *)0x0) {
    if ((PTreeRBNode *)(node->parent->base).left == node) {
      (node->parent->base).left = (PTreeBaseNode_ *)pPVar1;
    }
    else {
      (node->parent->base).right = (PTreeBaseNode_ *)pPVar1;
    }
  }
  (node->base).right = (pPVar1->base).left;
  if ((pPVar1->base).left != (PTreeBaseNode_ *)0x0) {
    (pPVar1->base).left[1].left = &node->base;
  }
  (pPVar1->base).left = &node->base;
  pPVar1->parent = node->parent;
  node->parent = pPVar1;
  if (pPVar1->parent == (PTreeRBNode_ *)0x0) {
    *root = (PTreeBaseNode *)pPVar1;
  }
  return;
}

Assistant:

static void
pp_tree_rb_rotate_left (PTreeRBNode *node, PTreeBaseNode **root)
{
	PTreeBaseNode *tmp_node;

	tmp_node = node->base.right;

	if (P_LIKELY (node->parent != NULL)) {
		if (node->parent->base.left == (PTreeBaseNode *) node)
			node->parent->base.left = tmp_node;
		else
			node->parent->base.right = tmp_node;
	}

	node->base.right = tmp_node->left;

	if (tmp_node->left != NULL)
		((PTreeRBNode *) tmp_node->left)->parent = node;

	tmp_node->left = (PTreeBaseNode *) node;
	((PTreeRBNode *) tmp_node)->parent = node->parent;
	node->parent = (PTreeRBNode *) tmp_node;

	if (P_UNLIKELY (((PTreeRBNode *) tmp_node)->parent == NULL))
		*root = tmp_node;
}